

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_lights.cpp
# Opt level: O0

void __thiscall DFireFlicker::DFireFlicker(DFireFlicker *this,sector_t *sector)

{
  short sVar1;
  int iVar2;
  sector_t *sector_local;
  DFireFlicker *this_local;
  
  DLighting::DLighting(&this->super_DLighting,sector);
  (this->super_DLighting).super_DSectorEffect.super_DThinker.super_DObject._vptr_DObject =
       (_func_int **)&PTR_StaticType_009f78d8;
  this->m_MaxLight = (int)sector->lightlevel;
  iVar2 = sector_t::FindMinSurroundingLight(sector,(int)sector->lightlevel);
  sVar1 = sector_t::ClampLight(iVar2 + 0x10);
  this->m_MinLight = (int)sVar1;
  this->m_Count = 4;
  return;
}

Assistant:

DFireFlicker::DFireFlicker (sector_t *sector)
	: DLighting (sector)
{
	m_MaxLight = sector->lightlevel;
	m_MinLight = sector_t::ClampLight(sector->FindMinSurroundingLight(sector->lightlevel) + 16);
	m_Count = 4;
}